

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::
~MatcherBase(MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }